

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O2

Family<prometheus::Counter> * __thiscall
prometheus::Registry::Add<prometheus::Counter>
          (Registry *this,string *name,string *help,Labels *labels)

{
  bool bVar1;
  Family<prometheus::Counter> *in_RAX;
  __normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>_>
  _Var2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  invalid_argument *piVar3;
  pointer *__ptr;
  _Head_base<0UL,_prometheus::Family<prometheus::Counter>_*,_false> _Var4;
  _Head_base<0UL,_prometheus::Family<prometheus::Counter>_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  std::mutex::lock(&this->mutex_);
  bVar1 = NameExistsInOtherType<prometheus::Counter>(this,name);
  if (bVar1) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Family name already exists with different type")
    ;
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>*,std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>>,__gnu_cxx::__ops::_Iter_pred<prometheus::Registry::Add<prometheus::Counter>(std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)_1_>>
                    ((this->counters_).
                     super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->counters_).
                     super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,name);
  if (_Var2._M_current !=
      (this->counters_).
      super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (this->insert_behavior_ == Merge) {
      __x = &Family<prometheus::Counter>::GetConstantLabels_abi_cxx11_
                       (((_Var2._M_current)->_M_t).
                        super___uniq_ptr_impl<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_prometheus::Family<prometheus::Counter>_*,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
                        .super__Head_base<0UL,_prometheus::Family<prometheus::Counter>_*,_false>.
                        _M_head_impl)->_M_t;
      bVar1 = std::operator==(__x,&labels->_M_t);
      if (bVar1) {
        _Var4._M_head_impl =
             ((_Var2._M_current)->_M_t).
             super___uniq_ptr_impl<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_prometheus::Family<prometheus::Counter>_*,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
             .super__Head_base<0UL,_prometheus::Family<prometheus::Counter>_*,_false>._M_head_impl;
        goto LAB_001523c1;
      }
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar3,"Family name already exists with different constant labels");
    }
    else {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar3,"Family name already exists");
    }
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  detail::
  make_unique<prometheus::Family<prometheus::Counter>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
            ((detail *)&local_38,name,help,labels);
  _Var4._M_head_impl = local_38._M_head_impl;
  std::
  vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>
  ::
  emplace_back<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>
            ((vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>
              *)&this->counters_,
             (unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
              *)&local_38);
  if (local_38._M_head_impl != (Family<prometheus::Counter> *)0x0) {
    (*((local_38._M_head_impl)->super_Collectable)._vptr_Collectable[1])();
  }
LAB_001523c1:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return _Var4._M_head_impl;
}

Assistant:

Family<T>& Registry::Add(const std::string& name, const std::string& help,
                         const Labels& labels) {
  std::lock_guard<std::mutex> lock{mutex_};

  if (NameExistsInOtherType<T>(name)) {
    throw std::invalid_argument(
        "Family name already exists with different type");
  }

  auto& families = GetFamilies<T>();

  auto same_name = [&name](const std::unique_ptr<Family<T>>& family) {
    return name == family->GetName();
  };

  auto it = std::find_if(families.begin(), families.end(), same_name);
  if (it != families.end()) {
    if (insert_behavior_ == InsertBehavior::Merge) {
      if ((*it)->GetConstantLabels() == labels) {
        return **it;
      }
      throw std::invalid_argument(
          "Family name already exists with different constant labels");
    } else {
      throw std::invalid_argument("Family name already exists");
    }
  }

  auto family = detail::make_unique<Family<T>>(name, help, labels);
  auto& ref = *family;
  families.push_back(std::move(family));
  return ref;
}